

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O3

void __thiscall IMLE::EM(IMLE *this,Z *z,X *x)

{
  Z *this_00;
  X *this_01;
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined8 uVar8;
  pointer pFVar9;
  pointer pFVar10;
  Index index_1;
  pointer pFVar11;
  double *pdVar12;
  double *pdVar13;
  double *pdVar14;
  ulong uVar15;
  ulong uVar16;
  double *pdVar17;
  long lVar18;
  iterator it;
  ActualDstType actualDst;
  undefined4 uVar19;
  undefined4 uVar20;
  double dVar21;
  Scalar SVar22;
  undefined1 in_XMM2 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  X sum_diagPsi;
  ThisEvaluator thisEval;
  Z sum_diagSigma;
  scalar_product_op<double,_double> local_379;
  undefined1 local_378 [16];
  double local_368;
  undefined8 uStack_360;
  DenseStorage<double,__1,__1,_1,_0> local_358;
  double local_348;
  plainobjectbase_evaluator_data<double,_0> local_340;
  double local_338;
  FastLinearExpert local_330;
  
  pFVar9 = (this->experts).
           super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>.
           super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pFVar10 = (this->experts).
            super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>.
            super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pFVar9 < pFVar10) {
    dVar21 = 0.0;
    pFVar11 = pFVar9;
    do {
      dVar21 = dVar21 + (pFVar11->super_LinearExpert).h;
      pFVar11 = pFVar11 + 1;
    } while (pFVar11 < pFVar10);
    if ((dVar21 != 0.0) || (NAN(dVar21))) {
      local_378._0_8_ = dVar21;
      if ((this->param).accelerated == false) {
        if (pFVar9 < pFVar10) {
          do {
            FastLinearExpert::e_step(pFVar9,z,x,(pFVar9->super_LinearExpert).h / dVar21);
            FastLinearExpert::m_step(pFVar9);
            pFVar9 = pFVar9 + 1;
            dVar21 = (double)local_378._0_8_;
          } while (pFVar9 < (this->experts).
                            super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                            .
                            super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
        }
      }
      else if (pFVar9 < pFVar10) {
        do {
          dVar4 = (pFVar9->super_LinearExpert).h / dVar21;
          if (0.001 < dVar4) {
            FastLinearExpert::e_step(pFVar9,z,x,dVar4);
            FastLinearExpert::m_step(pFVar9);
            pFVar10 = (this->experts).
                      super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                      .
                      super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            dVar21 = (double)local_378._0_8_;
          }
          in_XMM2 = ZEXT816(0x3f50624dd2f1a9fc);
          pFVar9 = pFVar9 + 1;
        } while (pFVar9 < pFVar10);
      }
      goto LAB_00146564;
    }
  }
  FastLinearExpert::FastLinearExpert(&local_330,this->d,this->D,z,x,this);
  std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::push_back
            (&(this->experts).
              super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
             ,&local_330);
  free(local_330.invSzz0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  free(local_330.invSzz.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  LinearExpert::~LinearExpert(&local_330.super_LinearExpert);
  FastLinearExpert::e_step
            ((this->experts).
             super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
             .
             super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1,z,x,1.0);
  FastLinearExpert::m_step
            ((this->experts).
             super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
             .
             super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1);
  this->M = (int)((ulong)((long)(this->experts).
                                super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                                .
                                super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->experts).
                               super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                               .
                               super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x5f02a3a1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"e_step: sum_h = 0.0! (Should not happen)",0x28);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
LAB_00146564:
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&local_330,
             (DenseStorage<double,__1,__1,_1,_0> *)&this->zeroZ);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            (&local_358,(DenseStorage<double,__1,__1,_1,_0> *)&this->zeroX);
  uVar7 = local_330.super_LinearExpert._0_8_;
  for (pFVar9 = (this->experts).
                super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                .
                super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pFVar9 < (this->experts).
               super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
               .
               super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
               ._M_impl.super__Vector_impl_data._M_finish; pFVar9 = pFVar9 + 1) {
    if (0 < (long)local_330.super_LinearExpert.Nu.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data) {
      pdVar14 = (pFVar9->super_LinearExpert).invSigma.
                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
      lVar18 = (pFVar9->super_LinearExpert).invSigma.
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
      pdVar17 = (double *)0x0;
      do {
        *(double *)(local_330.super_LinearExpert._0_8_ + pdVar17 * 8) =
             *pdVar14 + *(double *)(local_330.super_LinearExpert._0_8_ + pdVar17 * 8);
        pdVar17 = (double *)((long)pdVar17 + 1);
        pdVar14 = pdVar14 + lVar18 + 1;
      } while (local_330.super_LinearExpert.Nu.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
               pdVar17);
    }
    pdVar14 = (pFVar9->super_LinearExpert).invPsi.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    uVar16 = local_358.m_rows - (local_358.m_rows >> 0x3f) & 0xfffffffffffffffe;
    if (1 < local_358.m_rows) {
      lVar18 = 0;
      do {
        pdVar17 = pdVar14 + lVar18;
        dVar21 = pdVar17[1] + (local_358.m_data + lVar18)[1];
        auVar23._8_4_ = SUB84(dVar21,0);
        auVar23._0_8_ = *pdVar17 + local_358.m_data[lVar18];
        auVar23._12_4_ = (int)((ulong)dVar21 >> 0x20);
        *(undefined1 (*) [16])(local_358.m_data + lVar18) = auVar23;
        lVar18 = lVar18 + 2;
      } while (lVar18 < (long)uVar16);
    }
    if ((long)uVar16 < local_358.m_rows) {
      do {
        local_358.m_data[uVar16] = pdVar14[uVar16] + local_358.m_data[uVar16];
        uVar16 = uVar16 + 1;
      } while (local_358.m_rows != uVar16);
    }
  }
  local_378._8_8_ = 0;
  local_378._0_8_ = (double)this->M;
  local_348 = (this->param).wsigma;
  local_338 = (this->param).wSigma;
  local_368 = local_338 * local_348 * (this->param).sigma0;
  uStack_360 = 0;
  this_00 = &this->Sigma;
  pdVar14 = local_330.super_LinearExpert.Nu.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  if ((double *)
      (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != local_330.super_LinearExpert.Nu.
         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (Index)local_330.super_LinearExpert.Nu.
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_data,1);
    pdVar14 = (double *)
              (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
              .m_rows;
  }
  uVar8 = local_330.super_LinearExpert._0_8_;
  uVar19 = local_378._8_4_;
  uVar20 = local_378._12_4_;
  pdVar17 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
            m_data;
  pdVar12 = (double *)((long)pdVar14 - ((long)pdVar14 >> 0x3f) & 0xfffffffffffffffe);
  if (1 < (long)pdVar14) {
    lVar18 = 0;
    do {
      pdVar13 = (double *)(uVar7 + lVar18 * 8);
      dVar21 = pdVar13[1];
      pdVar1 = pdVar17 + lVar18;
      *pdVar1 = *pdVar13 * local_368;
      pdVar1[1] = dVar21 * local_368;
      lVar18 = lVar18 + 2;
    } while (lVar18 < (long)pdVar12);
  }
  local_378._0_8_ = (local_378._0_8_ * local_338 - local_348) * 0.5 + -1.0;
  local_378._8_4_ = uVar19;
  local_378._12_4_ = uVar20;
  if ((long)pdVar12 < (long)pdVar14) {
    do {
      pdVar17[(long)pdVar12] = *(double *)(uVar7 + pdVar12 * 8) * local_368;
      pdVar12 = (double *)((long)pdVar12 + 1);
    } while (pdVar14 != pdVar12);
  }
  dVar21 = (double)local_378._0_8_ * (double)local_378._0_8_;
  pdVar14 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data;
  uVar16 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  uVar15 = uVar16 - ((long)uVar16 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar16) {
    lVar18 = 0;
    do {
      in_XMM2._0_8_ = pdVar14[lVar18] + dVar21;
      in_XMM2._8_8_ = (pdVar14 + lVar18)[1] + dVar21;
      *(undefined1 (*) [16])(pdVar14 + lVar18) = in_XMM2;
      lVar18 = lVar18 + 2;
    } while (lVar18 < (long)uVar15);
  }
  if ((long)uVar15 < (long)uVar16) {
    do {
      pdVar14[uVar15] = pdVar14[uVar15] + dVar21;
      uVar15 = uVar15 + 1;
    } while (uVar16 != uVar15);
  }
  local_368 = (this->param).wSigma;
  uStack_360 = 0;
  pdVar14 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data;
  pdVar17 = pdVar14;
  if ((double *)
      (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != local_330.super_LinearExpert.Nu.
         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (Index)local_330.super_LinearExpert.Nu.
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_data,1);
    local_330.super_LinearExpert.Nu.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
    m_storage.m_data =
         (double *)
         (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_rows;
    pdVar17 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
              .m_data;
  }
  pdVar12 = local_358.m_data;
  pdVar13 = (double *)
            ((long)local_330.super_LinearExpert.Nu.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data -
             ((long)local_330.super_LinearExpert.Nu.
                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
             >> 0x3f) & 0xfffffffffffffffe);
  if (1 < (long)local_330.super_LinearExpert.Nu.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data) {
    lVar18 = 0;
    do {
      auVar23 = sqrtpd(in_XMM2,*(undefined1 (*) [16])(pdVar14 + lVar18));
      auVar24._0_8_ = auVar23._0_8_ + (double)local_378._0_8_;
      auVar24._8_8_ = auVar23._8_8_ + (double)local_378._0_8_;
      pdVar1 = (double *)(uVar8 + lVar18 * 8);
      auVar5._8_8_ = pdVar1[1] * local_368;
      auVar5._0_8_ = *pdVar1 * local_368;
      in_XMM2 = divpd(auVar24,auVar5);
      *(undefined1 (*) [16])(pdVar17 + lVar18) = in_XMM2;
      lVar18 = lVar18 + 2;
    } while (lVar18 < (long)pdVar13);
  }
  if ((long)pdVar13 <
      (long)local_330.super_LinearExpert.Nu.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data) {
    do {
      pdVar17[(long)pdVar13] =
           (SQRT(pdVar14[(long)pdVar13]) + (double)local_378._0_8_) /
           (*(double *)(uVar8 + pdVar13 * 8) * local_368);
      pdVar13 = (double *)((long)pdVar13 + 1);
    } while (local_330.super_LinearExpert.Nu.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
             pdVar13);
  }
  local_378._8_8_ = 0;
  local_378._0_8_ = (double)this->M;
  local_368 = (this->param).wPsi;
  uStack_360 = 0;
  local_348 = (this->param).wpsi;
  this_01 = &this->Psi;
  pdVar14 = (this->param).Psi0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_data;
  uVar16 = local_358.m_rows;
  if ((this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
      local_358.m_rows) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&this_01->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               local_358.m_rows,1);
    uVar16 = (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
  }
  pdVar13 = local_358.m_data;
  uVar19 = local_378._12_4_;
  auVar26._0_8_ = local_368 * local_348;
  auVar26._8_8_ = (double)uStack_360;
  pdVar17 = (this_01->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
            m_data;
  uVar15 = uVar16 - ((long)uVar16 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar16) {
    lVar18 = 0;
    do {
      pdVar1 = pdVar14 + lVar18;
      dVar21 = pdVar1[1];
      pdVar3 = pdVar12 + lVar18;
      dVar4 = pdVar3[1];
      pdVar2 = pdVar17 + lVar18;
      *pdVar2 = *pdVar1 * auVar26._0_8_ * *pdVar3;
      pdVar2[1] = dVar21 * auVar26._0_8_ * dVar4;
      lVar18 = lVar18 + 2;
    } while (lVar18 < (long)uVar15);
  }
  dVar21 = (local_378._0_8_ * local_368 - local_348) * 0.5 + -1.0;
  local_378._8_4_ = local_378._8_4_;
  local_378._0_8_ = dVar21;
  local_378._12_4_ = uVar19;
  if ((long)uVar15 < (long)uVar16) {
    do {
      pdVar17[uVar15] = pdVar14[uVar15] * auVar26._0_8_ * pdVar12[uVar15];
      uVar15 = uVar15 + 1;
    } while (uVar16 != uVar15);
  }
  dVar21 = dVar21 * dVar21;
  pdVar14 = (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data;
  uVar16 = (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  uVar15 = uVar16 - ((long)uVar16 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar16) {
    lVar18 = 0;
    do {
      auVar26._0_8_ = pdVar14[lVar18] + dVar21;
      auVar26._8_8_ = (pdVar14 + lVar18)[1] + dVar21;
      *(undefined1 (*) [16])(pdVar14 + lVar18) = auVar26;
      lVar18 = lVar18 + 2;
    } while (lVar18 < (long)uVar15);
  }
  if ((long)uVar15 < (long)uVar16) {
    do {
      pdVar14[uVar15] = pdVar14[uVar15] + dVar21;
      uVar15 = uVar15 + 1;
    } while (uVar16 != uVar15);
  }
  local_368 = (this->param).wPsi;
  uStack_360 = 0;
  pdVar14 = (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data;
  pdVar17 = pdVar14;
  if ((this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
      local_358.m_rows) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&this_01->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               local_358.m_rows,1);
    local_358.m_rows =
         (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
    ;
    pdVar17 = (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_data;
  }
  uVar16 = local_358.m_rows - (local_358.m_rows >> 0x3f) & 0xfffffffffffffffe;
  if (1 < local_358.m_rows) {
    lVar18 = 0;
    do {
      auVar23 = sqrtpd(auVar26,*(undefined1 (*) [16])(pdVar14 + lVar18));
      auVar25._0_8_ = auVar23._0_8_ + (double)local_378._0_8_;
      auVar25._8_8_ = auVar23._8_8_ + (double)local_378._0_8_;
      pdVar12 = pdVar13 + lVar18;
      auVar6._8_8_ = pdVar12[1] * local_368;
      auVar6._0_8_ = *pdVar12 * local_368;
      auVar26 = divpd(auVar25,auVar6);
      *(undefined1 (*) [16])(pdVar17 + lVar18) = auVar26;
      lVar18 = lVar18 + 2;
    } while (lVar18 < (long)uVar16);
  }
  if ((long)uVar16 < local_358.m_rows) {
    do {
      pdVar17[uVar16] =
           (SQRT(pdVar14[uVar16]) + (double)local_378._0_8_) / (pdVar13[uVar16] * local_368);
      uVar16 = uVar16 + 1;
    } while (local_358.m_rows != uVar16);
  }
  local_378._0_8_ = this->sig_level_noiseX_rbf;
  if ((this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
      0) {
    uVar19 = 0;
    uVar20 = 0x3ff00000;
  }
  else {
    local_340.data =
         (this_01->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    SVar22 = Eigen::internal::
             redux_impl<Eigen::internal::scalar_product_op<double,double>,Eigen::internal::redux_evaluator<Eigen::Matrix<double,-1,1,0,-1,1>>,3,0>
             ::run<Eigen::Matrix<double,_1,1,0,_1,1>>
                       ((redux_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_340,
                        &local_379,this_01);
    uVar19 = SUB84(SVar22,0);
    uVar20 = (undefined4)((ulong)SVar22 >> 0x20);
  }
  if ((double)CONCAT44(uVar20,uVar19) < 0.0) {
    dVar21 = sqrt((double)CONCAT44(uVar20,uVar19));
  }
  else {
    dVar21 = SQRT((double)CONCAT44(uVar20,uVar19));
  }
  this->pNoiseModelX = (double)local_378._0_8_ / dVar21;
  local_378._0_8_ = this->sig_level_noiseZ_rbf;
  if ((this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      == 0) {
    uVar19 = 0;
    uVar20 = 0x3ff00000;
  }
  else {
    local_340.data =
         (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    SVar22 = Eigen::internal::
             redux_impl<Eigen::internal::scalar_product_op<double,double>,Eigen::internal::redux_evaluator<Eigen::Matrix<double,-1,1,0,-1,1>>,3,0>
             ::run<Eigen::Matrix<double,_1,1,0,_1,1>>
                       ((redux_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_340,
                        &local_379,this_00);
    uVar19 = SUB84(SVar22,0);
    uVar20 = (undefined4)((ulong)SVar22 >> 0x20);
  }
  if ((double)CONCAT44(uVar20,uVar19) < 0.0) {
    dVar21 = sqrt((double)CONCAT44(uVar20,uVar19));
  }
  else {
    dVar21 = SQRT((double)CONCAT44(uVar20,uVar19));
  }
  this->pNoiseModelZ = (double)local_378._0_8_ / dVar21;
  local_378._0_8_ = this->sig_level_noiseZX_rbf;
  SVar22 = 1.0;
  if ((this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
      0) {
    local_340.data =
         (this_01->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    SVar22 = Eigen::internal::
             redux_impl<Eigen::internal::scalar_product_op<double,double>,Eigen::internal::redux_evaluator<Eigen::Matrix<double,-1,1,0,-1,1>>,3,0>
             ::run<Eigen::Matrix<double,_1,1,0,_1,1>>
                       ((redux_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_340,
                        &local_379,this_01);
  }
  uVar20 = 0x3ff00000;
  uVar19 = 0;
  if ((this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != 0) {
    local_340.data =
         (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    local_368 = SVar22;
    SVar22 = Eigen::internal::
             redux_impl<Eigen::internal::scalar_product_op<double,double>,Eigen::internal::redux_evaluator<Eigen::Matrix<double,-1,1,0,-1,1>>,3,0>
             ::run<Eigen::Matrix<double,_1,1,0,_1,1>>
                       ((redux_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_340,
                        &local_379,this_00);
    uVar19 = SUB84(SVar22,0);
    uVar20 = (undefined4)((ulong)SVar22 >> 0x20);
    SVar22 = local_368;
  }
  dVar21 = SVar22 * (double)CONCAT44(uVar20,uVar19);
  if (dVar21 < 0.0) {
    dVar21 = sqrt(dVar21);
  }
  else {
    dVar21 = SQRT(dVar21);
  }
  this->pNoiseModelZX = (double)local_378._0_8_ / dVar21;
  free(local_358.m_data);
  free((void *)local_330.super_LinearExpert._0_8_);
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::EM(Z const &z, X const &x)
{
    // Expectation Step
    Scal h, sum_h = 0.0;
    for(IMLE_TYPENAME Experts::iterator it=experts.begin(); it < experts.end(); it++)
        sum_h += it->get_h();

    if( sum_h == 0.0)
    {
        // Create new linear expert
#ifdef IMLE_NO_TEMPLATES
        experts.push_back( Expert(d,D,z,x,this) );
#else
        experts.push_back( Expert(z,x,this) );
#endif
        experts.back().e_step(z,x,1.0);
        experts.back().m_step();
        M = experts.size();
        std::cout << "e_step: sum_h = 0.0! (Should not happen)" << std::endl;
    }
    else if( param.accelerated )
        for(IMLE_TYPENAME Experts::iterator it=experts.begin(); it < experts.end(); it++)
        {
            if( (h = it->get_h()/sum_h) > 0.001 )
            {
                it->e_step( z, x, h );
                it->m_step();
            }

        }
    else
        for(IMLE_TYPENAME Experts::iterator it=experts.begin(); it < experts.end(); it++)
        {
            it->e_step( z, x, it->get_h()/sum_h );
            it->m_step();
        }

    // Maximization Step
    //
    Z sum_diagSigma = zeroZ;
    X sum_diagPsi = zeroX;
    for(IMLE_TYPENAME Experts::iterator it=experts.begin(); it < experts.end(); it++)
    {
        sum_diagSigma += it->invSigma.diagonal();
        sum_diagPsi += it->invPsi;
    }

    // Update common inverse-Wishart prior on Sigma
    Scal tmp = (M*param.wSigma - param.wsigma)/2.0 - 1.0;
    Sigma = param.wSigma * param.wsigma * param.sigma0 * sum_diagSigma;
    Sigma.array() += tmp*tmp;
    Sigma.array() = (Sigma.array().sqrt() + tmp) / (param.wSigma * sum_diagSigma.array());

    // Update common inverse-gamma prior on Psi
    tmp = (M*param.wPsi - param.wpsi)/2.0 - 1.0;
    Psi.array() = (param.wPsi * param.wpsi) * param.Psi0.array() * sum_diagPsi.array();
    Psi.array() += tmp*tmp;
    Psi.array() = (Psi.array().sqrt() + tmp) / (param.wPsi * sum_diagPsi.array());

    // Update outlier model
    pNoiseModelX = sig_level_noiseX_rbf / sqrt(Psi.prod());
    pNoiseModelZ = sig_level_noiseZ_rbf / sqrt(Sigma.prod());
    pNoiseModelZX = sig_level_noiseZX_rbf / sqrt(Psi.prod() * Sigma.prod());
}